

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fasttext::Dictionary::getLabel_abi_cxx11_(Dictionary *this,int32_t lid)

{
  invalid_argument *this_00;
  const_reference pvVar1;
  int in_EDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int in_stack_ffffffffffffffac;
  string local_38 [56];
  
  if ((-1 < in_EDX) && (in_EDX < *(int *)(in_RSI + 0x60))) {
    pbVar2 = in_RDI;
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RSI + 0x28)
                        ,(long)(in_EDX + *(int *)(in_RSI + 0x5c)));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
    return pbVar2;
  }
  pbVar2 = in_RDI;
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(in_stack_ffffffffffffffac);
  std::operator+((char *)pbVar2,in_RDI);
  std::operator+(pbVar2,(char *)in_RDI);
  std::invalid_argument::invalid_argument(this_00,local_38);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string Dictionary::getLabel(int32_t lid) const {
  if (lid < 0 || lid >= nlabels_) {
    throw std::invalid_argument(
        "Label id is out of range [0, " + std::to_string(nlabels_) + "]");
  }
  return words_[lid + nwords_].word;
}